

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O0

int quicly_local_cid_set_size(quicly_local_cid_set_t *set,size_t size)

{
  int iVar1;
  quicly_local_cid_set_t *in_RSI;
  long in_RDI;
  size_t i_1;
  size_t i;
  int is_pending;
  quicly_local_cid_set_t *set_00;
  quicly_local_cid_set_t *set_01;
  int local_14;
  
  local_14 = 0;
  if ((quicly_local_cid_set_t *)0x4 < in_RSI) {
    __assert_fail("size <= PTLS_ELEMENTSOF(set->cids)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                  ,0x6a,"int quicly_local_cid_set_size(quicly_local_cid_set_t *, size_t)");
  }
  if (*(quicly_local_cid_set_t **)(in_RDI + 0xf0) <= in_RSI) {
    for (set_01 = *(quicly_local_cid_set_t **)(in_RDI + 0xf0); set_01 < in_RSI;
        set_01 = (quicly_local_cid_set_t *)((long)&(set_01->plaintext).master_id + 1)) {
      *(undefined4 *)(in_RDI + 0x10 + (long)set_01 * 0x38) = 0;
    }
    *(quicly_local_cid_set_t **)(in_RDI + 0xf0) = in_RSI;
    set_00 = (quicly_local_cid_set_t *)0x0;
    do {
      if (in_RSI <= set_00) {
        return local_14;
      }
      if (*(int *)(in_RDI + 0x10 + (long)set_00 * 0x38) == 0) {
        iVar1 = generate_cid(set_00,0x12f8a2);
        if (iVar1 == 0) {
          return local_14;
        }
        do_mark_pending(set_01,(size_t)set_00);
        local_14 = 1;
      }
      set_00 = (quicly_local_cid_set_t *)((long)&(set_00->plaintext).master_id + 1);
    } while( true );
  }
  __assert_fail("set->_size <= size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                ,0x6b,"int quicly_local_cid_set_size(quicly_local_cid_set_t *, size_t)");
}

Assistant:

int quicly_local_cid_set_size(quicly_local_cid_set_t *set, size_t size)
{
    int is_pending = 0;

    assert(size <= PTLS_ELEMENTSOF(set->cids));
    assert(set->_size <= size);

    for (size_t i = set->_size; i < size; i++)
        set->cids[i].state = QUICLY_LOCAL_CID_STATE_IDLE;

    set->_size = size;

    /* First we prepare N CIDs (to be precise here we prepare N-1, as we already had one upon initialization).
     * Later, every time one of the CIDs is retired, we immediately prepare one additional CID
     * to always fill the CID list. */
    for (size_t i = 0; i < size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_IDLE)
            continue;

        if (!generate_cid(set, i))
            break;
        do_mark_pending(set, i);
        is_pending = 1;
    }

    return is_pending;
}